

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

BytesValue * google::protobuf::Arena::CreateMaybeMessage<google::protobuf::BytesValue>(Arena *arena)

{
  BytesValue *this;
  
  if (arena == (Arena *)0x0) {
    this = (BytesValue *)operator_new(0x20);
    BytesValue::BytesValue(this);
  }
  else {
    AllocHook(arena,(type_info *)&BytesValue::typeinfo,0x20);
    this = (BytesValue *)AllocateAlignedNoHook(arena,0x20);
    BytesValue::BytesValue(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::BytesValue* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::BytesValue >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::BytesValue >(arena);
}